

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

int Train(void *hPtr,char *input,char *output,TrainingArgs trainArgs,AutotuneArgs autotuneArgs,
         TrainProgressCallback trainCallback,AutotuneProgressCallback autotuneCallback,char *label,
         char *pretrainedVectors,bool debug)

{
  bool bVar1;
  int64_t iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  TrainingArgs *pTVar7;
  undefined1 *puVar8;
  TrainingArgs in_stack_fffffffffffffaf8;
  string outPath;
  _Any_data local_448;
  code *local_438;
  code *pcStack_430;
  string modelPath;
  string vectorsPath;
  Args args;
  ofstream stream;
  
  pTVar7 = &trainArgs;
  puVar8 = &stack0xfffffffffffffaf8;
  for (lVar4 = 100; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = *(undefined1 *)&pTVar7->lr;
    pTVar7 = (TrainingArgs *)((long)&pTVar7->lr + 1);
    puVar8 = puVar8 + 1;
  }
  CreateArgs(&args,in_stack_fffffffffffffaf8,autotuneArgs,label,pretrainedVectors);
  if (input == (char *)0x0) {
    input = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stream,input,(allocator<char> *)&outPath);
  std::__cxx11::string::operator=((string *)&args.input,(string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  if (output == (char *)0x0) {
    output = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stream,output,(allocator<char> *)&outPath);
  std::__cxx11::string::operator=((string *)&args.output,(string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  if (args.input._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&_lastError_abi_cxx11_);
    iVar6 = -1;
    goto LAB_0014e383;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outPath,output,(allocator<char> *)&stream);
  if (outPath._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stream,".bin",(allocator<char> *)&vectorsPath);
    bVar1 = EndsWith(&outPath,(string *)&stream,true);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&stream);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&modelPath,".ftz",(allocator<char> *)local_448._M_pod_data);
      bVar1 = EndsWith(&outPath,&modelPath,true);
      std::__cxx11::string::~string((string *)&modelPath);
      std::__cxx11::string::~string((string *)&stream);
      if (!bVar1) goto LAB_0014daa6;
    }
    std::__cxx11::string::substr((ulong)&stream,(ulong)&outPath);
    std::__cxx11::string::operator=((string *)&outPath,(string *)&stream);
    std::__cxx11::string::~string((string *)&stream);
  }
LAB_0014daa6:
  modelPath._M_dataplus._M_p = (pointer)&modelPath.field_2;
  modelPath._M_string_length = 0;
  vectorsPath._M_dataplus._M_p = (pointer)&vectorsPath.field_2;
  vectorsPath._M_string_length = 0;
  modelPath.field_2._M_local_buf[0] = '\0';
  vectorsPath.field_2._M_local_buf[0] = '\0';
  if (outPath._M_string_length != 0) {
    bVar1 = fasttext::Args::hasAutotune(&args);
    if (bVar1) {
      iVar2 = fasttext::Args::getAutotuneModelSize(&args);
      if (iVar2 == -1) goto LAB_0014db0a;
      pcVar5 = ".ftz";
    }
    else {
LAB_0014db0a:
      pcVar5 = ".bin";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                   &outPath,pcVar5);
    std::__cxx11::string::operator=((string *)&modelPath,(string *)&stream);
    std::__cxx11::string::~string((string *)&stream);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                   &outPath,".vec");
    std::__cxx11::string::operator=((string *)&vectorsPath,(string *)&stream);
    std::__cxx11::string::~string((string *)&stream);
  }
  if (debug) {
    std::ofstream::ofstream(&stream,"_train.txt",_S_out);
    poVar3 = std::operator<<((ostream *)&stream,"= eargs");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&stream,input);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,output);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<double>(trainArgs.lr);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.lrUpdateRate);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.dim);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.ws);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.epoch);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.minCount);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.minCountLabel);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.neg);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.wordNgrams);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.loss);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.model);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.bucket);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.minn);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.maxn);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.thread);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<double>(trainArgs.t);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    if (label == (char *)0x0) {
      label = "";
    }
    poVar3 = std::operator<<(poVar3,label);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.verbose);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    if (pretrainedVectors == (char *)0x0) {
      pretrainedVectors = "";
    }
    poVar3 = std::operator<<(poVar3,pretrainedVectors);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,trainArgs.seed);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    if (autotuneArgs.validationFile == (char *)0x0) {
      autotuneArgs.validationFile = "";
    }
    poVar3 = std::operator<<(poVar3,autotuneArgs.validationFile);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    if (autotuneArgs.metric == (char *)0x0) {
      autotuneArgs.metric = "";
    }
    poVar3 = std::operator<<(poVar3,autotuneArgs.metric);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,autotuneArgs.predictions);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,autotuneArgs.duration);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    pcVar5 = "";
    if (autotuneArgs.modelSize != (char *)0x0) {
      pcVar5 = autotuneArgs.modelSize;
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,autotuneArgs.verbose);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&stream,"= args");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&stream,(string *)&args.input);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)&args.output);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<double>(args.lr);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.lrUpdateRate);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.dim);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.ws);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.epoch);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.minCount);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.minCountLabel);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.neg);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.wordNgrams);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.loss);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.model);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.bucket);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.minn);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.maxn);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.thread);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<double>(args.t);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)&args.label);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.verbose);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)&args.pretrainedVectors);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.seed);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)&args.autotuneValidationFile);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)&args.autotuneMetric);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.autotunePredictions);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.autotuneDuration);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)&args.autotuneModelSize);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.autotuneVerbose);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::close();
    std::ofstream::~ofstream(&stream);
  }
  bVar1 = fasttext::Args::hasAutotune(&args);
  if (bVar1) {
    fasttext::Autotune::Autotune((Autotune *)&stream,(FastText *)hPtr);
    local_438 = (code *)0x0;
    pcStack_430 = (code *)0x0;
    local_448._M_unused._M_object = (AutotuneProgressCallback)0x0;
    local_448._8_8_ = 0;
    if (autotuneCallback != (AutotuneProgressCallback)0x0) {
      pcStack_430 = std::
                    _Function_handler<void_(double,_int,_double,_double),_void_(*)(double,_int,_double,_double)>
                    ::_M_invoke;
      local_438 = std::
                  _Function_handler<void_(double,_int,_double,_double),_void_(*)(double,_int,_double,_double)>
                  ::_M_manager;
      local_448._M_unused._0_8_ = (undefined8)autotuneCallback;
    }
    fasttext::Autotune::train((Autotune *)&stream,&args,(AutotuneCallback *)&local_448);
    std::_Function_base::~_Function_base((_Function_base *)&local_448);
    fasttext::Autotune::~Autotune((Autotune *)&stream);
  }
  else {
    _stream = (TrainProgressCallback)0x0;
    if (trainCallback != (TrainProgressCallback)0x0) {
      _stream = trainCallback;
    }
    fasttext::FastText::train((FastText *)hPtr,&args,(TrainCallback *)&stream);
    std::_Function_base::~_Function_base((_Function_base *)&stream);
  }
  if (modelPath._M_string_length != 0) {
    fasttext::FastText::saveModel((FastText *)hPtr,&modelPath);
  }
  iVar6 = 0;
  if (vectorsPath._M_string_length != 0) {
    fasttext::FastText::saveVectors((FastText *)hPtr,&vectorsPath);
  }
  std::__cxx11::string::~string((string *)&vectorsPath);
  std::__cxx11::string::~string((string *)&modelPath);
  std::__cxx11::string::~string((string *)&outPath);
LAB_0014e383:
  fasttext::Args::~Args(&args);
  return iVar6;
}

Assistant:

Train(void* hPtr, const char* input, const char* output, TrainingArgs trainArgs, AutotuneArgs autotuneArgs,
        TrainProgressCallback trainCallback, AutotuneProgressCallback autotuneCallback,
        const char* label, const char* pretrainedVectors, bool debug)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto args = CreateArgs(trainArgs, autotuneArgs, label, pretrainedVectors);
    args.input = std::string(EMPTYIFNULL(input));
    args.output = std::string(EMPTYIFNULL(output));

    if (args.input.empty())
    {
        _lastError = "Empty input file specified!";
        return -1;
    }

    std::string outPath(EMPTYIFNULL(output));
    if (!outPath.empty() && (EndsWith(outPath, ".bin", true) || EndsWith(outPath, ".ftz", true))) {
        outPath = outPath.substr(0, outPath.length()-4);
    }

    std::string modelPath;
    std::string vectorsPath;

    if (!outPath.empty()) {
        modelPath = args.hasAutotune() && args.getAutotuneModelSize() != Args::kUnlimitedModelSize
                         ? outPath + ".ftz"
                         : outPath + ".bin";
        vectorsPath = outPath + ".vec";
    }

    if (debug)
    {
        ofstream stream("_train.txt");
        stream << "= eargs" << endl;

        stream << EMPTYIFNULL(input) << endl
            << EMPTYIFNULL(output) << endl
            << trainArgs.lr << endl
            << trainArgs.lrUpdateRate << endl
            << trainArgs.dim << endl
            << trainArgs.ws << endl
            << trainArgs.epoch << endl
            << trainArgs.minCount << endl
            << trainArgs.minCountLabel << endl
            << trainArgs.neg << endl
            << trainArgs.wordNgrams << endl
            << (int)trainArgs.loss << endl
            << (int)trainArgs.model << endl
            << trainArgs.bucket << endl
            << trainArgs.minn << endl
            << trainArgs.maxn << endl
            << trainArgs.thread << endl
            << trainArgs.t << endl
            << EMPTYIFNULL(label) << endl
            << trainArgs.verbose << endl
            << EMPTYIFNULL(pretrainedVectors) << endl
            << trainArgs.saveOutput << endl
            << trainArgs.seed << endl
            << trainArgs.qout << endl
            << trainArgs.retrain << endl
            << trainArgs.qnorm << endl
            << trainArgs.cutoff << endl
            << trainArgs.dsub << endl

            << EMPTYIFNULL(autotuneArgs.validationFile) << endl
            << EMPTYIFNULL(autotuneArgs.metric) << endl
            << autotuneArgs.predictions << endl
            << autotuneArgs.duration << endl
            << EMPTYIFNULL(autotuneArgs.modelSize) << endl
            << autotuneArgs.verbose << endl;

        stream << "= args" << endl;

        stream << args.input << endl
            << args.output << endl
            << args.lr << endl
            << args.lrUpdateRate << endl
            << args.dim << endl
            << args.ws << endl
            << args.epoch << endl
            << args.minCount << endl
            << args.minCountLabel << endl
            << args.neg << endl
            << args.wordNgrams << endl
            << (int)args.loss << endl
            << (int)args.model << endl
            << args.bucket << endl
            << args.minn << endl
            << args.maxn << endl
            << args.thread << endl
            << args.t << endl
            << args.label << endl
            << args.verbose << endl
            << args.pretrainedVectors << endl
            << args.saveOutput << endl
            << args.seed << endl
            << args.qout << endl
            << args.retrain << endl
            << args.qnorm << endl
            << args.cutoff << endl
            << args.dsub << endl
            << args.autotuneValidationFile << endl
            << args.autotuneMetric << endl
            << args.autotunePredictions << endl
            << args.autotuneDuration << endl
            << args.autotuneModelSize << endl
            << args.autotuneVerbose << endl;

        stream.close();
    }

    try {
        if (args.hasAutotune())
        {
            Autotune autotune(fastText);
            autotune.train(args, autotuneCallback);
        }
        else
            fastText->train(args, trainCallback);

        if (!modelPath.empty())
            fastText->saveModel(modelPath);

        if (!vectorsPath.empty())
            fastText->saveVectors(vectorsPath);

        return 0;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}